

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  char cVar3;
  ostream *poVar4;
  undefined8 in_R9;
  string expression;
  string out_fname;
  Scope scope;
  ofstream asm_out;
  Parser parser;
  long *local_bd0;
  string local_bc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_ba8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b98 [2];
  Scope local_b88;
  long local_ae8;
  undefined4 auStack_ae0 [60];
  ios_base local_9f0 [264];
  Parser local_8e8;
  
  paVar1 = &local_bc8.field_2;
  local_bc8._M_string_length = 0;
  local_bc8.field_2._M_local_buf[0] = '\0';
  local_bc8._M_dataplus._M_p = (pointer)paVar1;
  if ((argc < 2) || ((pcVar2 = argv[1], *pcVar2 == '-' && (pcVar2[1] == '\0')))) {
    cVar3 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '\b');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_bc8,cVar3);
  }
  else {
    std::ifstream::ifstream(&local_8e8,pcVar2,_S_in);
    local_ae8 = 0;
    auStack_ae0[0] = 0xffffffff;
    std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_bc8,local_bc8._M_dataplus._M_p,
               local_bc8._M_dataplus._M_p + (long)(_NFA_base *)local_bc8._M_string_length,
               *(undefined8 *)
                (&local_8e8.RegexMinus._M_loc + *(long *)(local_8e8.RegexLeftParen._0_8_ + -0x18)),
               0xffffffff,in_R9,0,0xffffffff);
    std::ifstream::~ifstream(&local_8e8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Input:\n",7);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,local_bc8._M_dataplus._M_p,local_bc8._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_ba8,argv[1],(allocator<char> *)&local_8e8);
  std::__cxx11::string::append((char *)local_ba8);
  std::ofstream::ofstream(&local_ae8,(string *)local_ba8,_S_out);
  VPLGrammar::Parser::Parser(&local_8e8);
  local_8e8.str_ = &local_bc8;
  local_8e8.pos_._M_current = local_bc8._M_dataplus._M_p;
  VPLGrammar::Parser::ParseMainRule((Parser *)&local_bd0);
  (**(code **)(*local_bd0 + 0x20))(local_bd0,&std::cout);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  vpl::Scope::Scope(&local_b88,(ostream *)&local_ae8);
  (**(code **)(*local_bd0 + 0x28))(local_bd0,&local_b88,&local_ae8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_b88.func_name_map_._M_h);
  if (local_b88.stack_pos_hist_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b88.stack_pos_hist_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b88.stack_pos_hist_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b88.stack_pos_hist_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<vpl::NameScope,_std::allocator<vpl::NameScope>_>::~vector(&local_b88.scopes_);
  std::vector<vpl::Function,_std::allocator<vpl::Function>_>::~vector(&local_b88.functions_);
  if (local_bd0 != (long *)0x0) {
    (**(code **)(*local_bd0 + 8))();
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  VPLGrammar::Parser::~Parser(&local_8e8);
  local_ae8 = _VTT;
  *(undefined8 *)((long)auStack_ae0 + *(long *)(_VTT + -0x18) + -8) = __filebuf;
  std::filebuf::~filebuf((filebuf *)auStack_ae0);
  std::ios_base::~ios_base(local_9f0);
  if (local_ba8[0] != local_b98) {
    operator_delete(local_ba8[0],(ulong)((long)&(local_b98[0]._M_pi)->_vptr__Sp_counted_base + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bc8._M_dataplus._M_p != paVar1) {
    operator_delete(local_bc8._M_dataplus._M_p,
                    CONCAT71(local_bc8.field_2._M_allocated_capacity._1_7_,
                             local_bc8.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    std::string expression;

    if (argc > 1 && std::strcmp(argv[1], "-") != 0) {
        std::ifstream fin(argv[1]);
        expression.assign((std::istreambuf_iterator<char>(fin)), (std::istreambuf_iterator<char>()));
    } else {
        std::getline(std::cin, expression);
    }
    std::cerr << "Input:\n" << expression << std::endl;

    std::string out_fname = argv[1];
    out_fname += ".vasm";
    std::ofstream asm_out(out_fname);

    VPLGrammar::Parser parser;
    try {
        auto expr = parser.Parse(expression);
        expr->Print(std::cout);
        std::cout << std::endl;

        vpl::Scope scope(asm_out);
        expr->BuildProgram(&scope, asm_out);
    } catch (std::exception& ex) {
        std::cout << ex.what();
    }
    std::cout << std::endl;
    return 0;
}